

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_CharMap find_variant_selector_charmap(FT_Face face)

{
  FT_CharMap *ppFVar1;
  FT_CharMap charmap;
  FT_Long FVar2;
  FT_CharMap *ppFVar3;
  
  ppFVar3 = face->charmaps;
  if ((ppFVar3 != (FT_CharMap *)0x0) && (0 < (long)face->num_charmaps)) {
    ppFVar1 = ppFVar3 + face->num_charmaps;
    do {
      charmap = *ppFVar3;
      if (((charmap->platform_id == 0) && (charmap->encoding_id == 5)) &&
         (FVar2 = FT_Get_CMap_Format(charmap), FVar2 == 0xe)) {
        return *ppFVar3;
      }
      ppFVar3 = ppFVar3 + 1;
    } while (ppFVar3 < ppFVar1);
  }
  return (FT_CharMap)0x0;
}

Assistant:

static FT_CharMap
  find_variant_selector_charmap( FT_Face  face )
  {
    FT_CharMap*  first;
    FT_CharMap*  end;
    FT_CharMap*  cur;


    /* caller should have already checked that `face' is valid */
    FT_ASSERT( face );

    first = face->charmaps;

    if ( !first )
      return NULL;

    end = first + face->num_charmaps;  /* points after the last one */

    for ( cur = first; cur < end; cur++ )
    {
      if ( cur[0]->platform_id == TT_PLATFORM_APPLE_UNICODE    &&
           cur[0]->encoding_id == TT_APPLE_ID_VARIANT_SELECTOR &&
           FT_Get_CMap_Format( cur[0] ) == 14                  )
        return cur[0];
    }

    return NULL;
  }